

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mpint.c
# Opt level: O1

void mp_rshift_safe_in_place(mp_int *r,size_t bits)

{
  ulong uVar1;
  BignumInt *pBVar2;
  long lVar3;
  byte bVar4;
  uint bit;
  ulong uVar5;
  ulong uVar6;
  BignumInt BVar7;
  ulong uVar8;
  BignumInt *pBVar9;
  bool bVar10;
  
  uVar1 = r->nw;
  if (uVar1 != 0) {
    pBVar2 = r->w;
    uVar5 = 0;
    do {
      if ((long)(uVar1 - (bits >> 6)) < 0) {
        BVar7 = 0;
      }
      else {
        BVar7 = pBVar2[uVar5];
      }
      pBVar2[uVar5] = BVar7;
      uVar5 = uVar5 + 1;
    } while (uVar1 != uVar5);
    pBVar2 = r->w;
    bVar4 = 0;
    do {
      uVar6 = 1L << (bVar4 & 0x3f);
      uVar5 = uVar1;
      uVar8 = uVar6;
      pBVar9 = pBVar2;
      do {
        if (uVar8 < uVar1) {
          BVar7 = r->w[uVar8];
        }
        else {
          BVar7 = 0;
        }
        if ((uVar6 & bits >> 6) == 0) {
          BVar7 = *pBVar9;
        }
        *pBVar9 = BVar7;
        pBVar9 = pBVar9 + 1;
        uVar8 = uVar8 + 1;
        uVar5 = uVar5 - 1;
      } while (uVar5 != 0);
      bVar4 = bVar4 + 1;
    } while (uVar1 >> (bVar4 & 0x3f) != 0);
  }
  lVar3 = 0;
  do {
    if (uVar1 != 0) {
      bVar4 = (byte)(1 << ((byte)lVar3 & 0x1f));
      pBVar2 = r->w;
      uVar5 = 1;
      do {
        if (uVar5 < uVar1) {
          BVar7 = pBVar2[uVar5];
        }
        else {
          BVar7 = 0;
        }
        uVar8 = BVar7 << (0x40 - bVar4 & 0x3f) | pBVar2[uVar5 - 1] >> (bVar4 & 0x3f);
        if (((uint)(1L << ((byte)lVar3 & 0x3f)) & (uint)bits & 0x3f) == 0) {
          uVar8 = pBVar2[uVar5 - 1];
        }
        pBVar2[uVar5 - 1] = uVar8;
        bVar10 = uVar5 != uVar1;
        uVar5 = uVar5 + 1;
      } while (bVar10);
    }
    lVar3 = lVar3 + 1;
  } while (lVar3 != 6);
  return;
}

Assistant:

static void mp_rshift_safe_in_place(mp_int *r, size_t bits)
{
    size_t wordshift = bits / BIGNUM_INT_BITS;
    size_t bitshift = bits % BIGNUM_INT_BITS;

    unsigned clear = (r->nw - wordshift) >> (CHAR_BIT * sizeof(size_t) - 1);
    mp_cond_clear(r, clear);

    for (unsigned bit = 0; r->nw >> bit; bit++) {
        size_t word_offset = (size_t)1 << bit;
        BignumInt mask = -(BignumInt)((wordshift >> bit) & 1);
        for (size_t i = 0; i < r->nw; i++) {
            BignumInt w = mp_word(r, i + word_offset);
            r->w[i] ^= (r->w[i] ^ w) & mask;
        }
    }

    /*
     * That's done the shifting by words; now we do the shifting by
     * bits.
     */
    for (unsigned bit = 0; bit < BIGNUM_INT_BITS_BITS; bit++) {
        unsigned shift = 1 << bit, upshift = BIGNUM_INT_BITS - shift;
        BignumInt mask = -(BignumInt)((bitshift >> bit) & 1);
        for (size_t i = 0; i < r->nw; i++) {
            BignumInt w = ((r->w[i] >> shift) | (mp_word(r, i+1) << upshift));
            r->w[i] ^= (r->w[i] ^ w) & mask;
        }
    }
}